

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFContext::getLineTableForUnit
          (DWARFContext *this,DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  _Rb_tree_header *p_Var1;
  unsigned_long uVar2;
  DWARFObject *pDVar3;
  long *plVar4;
  DWARFDataExtractor *DebugLineData;
  uint32_t uVar5;
  pointer __p;
  unsigned_long *puVar6;
  function<void_(llvm::Error)> *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  DWARFContext *Ctx;
  Optional<unsigned_long> OVar8;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar9;
  function<void_(llvm::Error)> local_c0;
  undefined1 auStack_a0 [8];
  DWARFDataExtractor lineData;
  undefined1 local_68 [8];
  DWARFDie UnitDIE;
  Optional<unsigned_long> Offset;
  
  if ((U->field_7).LocSection == (DWARFSection *)0x0) {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__uniq_ptr_impl<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::reset
              ((__uniq_ptr_impl<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_> *)
               &(U->field_7).LocSectionData,__p);
  }
  _local_68 = DWARFUnit::getUnitDIE((DWARFUnit *)RecoverableErrorCallback,true);
  if (local_68 != (DWARFUnit *)0x0 && local_68._8_8_ != (DWARFDebugInfoEntry *)0x0) {
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)auStack_a0,(DWARFDie *)local_68,DW_AT_stmt_list
                  );
    OVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)auStack_a0);
    UnitDIE.Die = (DWARFDebugInfoEntry *)OVar8.Storage.field_0;
    if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar6 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&UnitDIE.Die);
      uVar2 = *puVar6;
      uVar5 = DWARFUnit::getLineTableOffset((DWARFUnit *)RecoverableErrorCallback);
      Ctx = (DWARFContext *)(uVar5 + uVar2);
      auStack_a0 = (undefined1  [8])
                   DWARFDebugLine::getLineTable
                             ((DWARFDebugLine *)(U->field_7).LocSection,(uint64_t)Ctx);
      if (auStack_a0 != (undefined1  [8])0x0) {
        Expected<llvm::DWARFDebugLine::LineTable_const*>::
        Expected<llvm::DWARFDebugLine::LineTable_const*>
                  ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,(LineTable **)auStack_a0
                   ,(type *)0x0);
        uVar7 = extraout_RDX;
        goto LAB_00d7eeca;
      }
      pDVar3 = (DWARFObject *)RecoverableErrorCallback[4].super__Function_base._M_manager;
      if (Ctx < (DWARFContext *)(pDVar3->Dummy).Data.Data) {
        plVar4 = *(long **)((long)&(U->RngListTable).Storage.field_0 + 0x90);
        lineData.super_DataExtractor.Data.Length._0_1_ = (**(code **)(*plVar4 + 0x28))();
        lineData.super_DataExtractor.Data.Length._1_1_ =
             RecoverableErrorCallback[1].super__Function_base._M_functor._M_pod_data[2];
        auStack_a0 = (undefined1  [8])pDVar3->_vptr_DWARFObject;
        lineData.super_DataExtractor.Data.Data = (pDVar3->Dummy).Data.Data;
        DebugLineData = (DWARFDataExtractor *)(U->field_7).LocSection;
        lineData.super_DataExtractor._16_8_ = plVar4;
        lineData.Obj = pDVar3;
        std::function<void_(llvm::Error)>::function(&local_c0,in_RCX);
        DWARFDebugLine::getOrParseLineTable
                  ((DWARFDebugLine *)this,DebugLineData,(uint64_t)auStack_a0,Ctx,U,
                   RecoverableErrorCallback);
        std::_Function_base::~_Function_base(&local_c0.super__Function_base);
        uVar7 = extraout_RDX_00;
        goto LAB_00d7eeca;
      }
    }
  }
  auStack_a0 = (undefined1  [8])0x0;
  Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<decltype(nullptr)>
            ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,(void **)auStack_a0,
             (type *)0x0);
  uVar7 = extraout_RDX_01;
LAB_00d7eeca:
  EVar9._8_8_ = uVar7;
  EVar9.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar9;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFContext::getLineTableForUnit(
    DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!Line)
    Line.reset(new DWARFDebugLine);

  auto UnitDIE = U->getUnitDIE();
  if (!UnitDIE)
    return nullptr;

  auto Offset = toSectionOffset(UnitDIE.find(DW_AT_stmt_list));
  if (!Offset)
    return nullptr; // No line table for this compile unit.

  uint64_t stmtOffset = *Offset + U->getLineTableOffset();
  // See if the line table is cached.
  if (const DWARFLineTable *lt = Line->getLineTable(stmtOffset))
    return lt;

  // Make sure the offset is good before we try to parse.
  if (stmtOffset >= U->getLineSection().Data.size())
    return nullptr;

  // We have to parse it first.
  DWARFDataExtractor lineData(*DObj, U->getLineSection(), isLittleEndian(),
                              U->getAddressByteSize());
  return Line->getOrParseLineTable(lineData, stmtOffset, *this, U,
                                   RecoverableErrorCallback);
}